

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O0

unique_ptr<relive::Track,_std::default_delete<relive::Track>_> __thiscall
relive::ReLiveDB::fetchTrack(ReLiveDB *this,int64_t trackId)

{
  _Head_base<0UL,_relive::Track_*,_false> in_RDI;
  long in_stack_00000010;
  storage_t<_86c824a_> *in_stack_00000018;
  lock_guard<std::recursive_mutex> lock;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_RDI._M_head_impl,
             (mutex_type *)in_RDI._M_head_impl);
  storage_abi_cxx11_();
  sqlite_orm::internal::storage_t<$86c824a$>::get_pointer<relive::Track,_long>
            (in_stack_00000018,in_stack_00000010);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x169ac0);
  return (__uniq_ptr_data<relive::Track,_std::default_delete<relive::Track>,_true,_true>)
         (tuple<relive::Track_*,_std::default_delete<relive::Track>_>)in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<Track> ReLiveDB::fetchTrack(int64_t trackId)
{
    std::lock_guard<Mutex> lock{_mutex};
    return storage().get_pointer<Track>(trackId);
}